

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.h
# Opt level: O0

void __thiscall HighsIis::~HighsIis(HighsIis *this)

{
  vector<HighsIisInfo,_std::allocator<HighsIisInfo>_> *unaff_retaddr;
  
  std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  return;
}

Assistant:

HighsIis() {}